

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O3

void __thiscall
pg::PSISolver::compute_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int v)

{
  void *__dest;
  int *piVar1;
  Worker *pWVar2;
  uint v_00;
  ulong uVar3;
  uint uVar4;
  TD_compute_val *t;
  int iVar5;
  Task *pTVar6;
  long lVar7;
  
  lVar7 = (long)v;
  *(undefined4 *)(done + lVar7 * 4) = 1;
  iVar5 = *(int *)(str + lVar7 * 4);
  __dest = (void *)(val + (long)(int)(v * k) * 4);
  if (((long)iVar5 == -1) || (*(int *)(halt + (long)iVar5 * 4) != 0)) {
    memset(__dest,0,(ulong)k << 2);
  }
  else {
    memcpy(__dest,(void *)(val + (long)(int)(iVar5 * k) * 4),(ulong)k << 2);
  }
  piVar1 = (int *)((long)__dest + (long)((this->super_Solver).game)->_priority[lVar7] * 4);
  *piVar1 = *piVar1 + 1;
  v_00 = *(uint *)(first_in + lVar7 * 4);
  uVar3 = (ulong)(int)v_00;
  if (uVar3 != 0xffffffffffffffff) {
    uVar4 = *(uint *)(next_in + uVar3 * 4);
    if (uVar4 == 0xffffffff) {
      iVar5 = 0;
    }
    else {
      lVar7 = (long)__lace_dq_head << 0x1a;
      iVar5 = 0;
      pTVar6 = __lace_dq_head;
      do {
        v_00 = uVar4;
        if (__lace_dq_head == __lace_worker->end) {
          lace_abort_stack_overflow();
        }
        __lace_dq_head->f = compute_val_WRAP;
        (__lace_dq_head->thief)._M_b._M_p = (__pointer_type)0x1;
        *(int *)__lace_dq_head->d = (int)uVar3;
        *(PSISolver **)(__lace_dq_head->d + 8) = this;
        uVar3 = (ulong)v_00;
        pWVar2 = __lace_worker->_public;
        if (__lace_worker->allstolen == '\0') {
          if (pWVar2->movesplit != '\0') {
            uVar4 = (uint)((int)((ulong)((long)pTVar6 - (long)__lace_worker->dq) >> 6) + 2 +
                          (int)((ulong)((long)__lace_worker->split - (long)__lace_worker->dq) >> 6))
                    >> 1;
            LOCK();
            *(uint *)((long)&pWVar2->ts + 4) = uVar4;
            UNLOCK();
            __lace_worker->split = __lace_worker->dq + uVar4;
            pWVar2->movesplit = '\0';
          }
        }
        else {
          if (pWVar2->movesplit != '\0') {
            pWVar2->movesplit = '\0';
          }
          LOCK();
          pWVar2->ts = (TailSplit)
                       ((lVar7 + (long)__lace_worker->dq * -0x4000000 & 0xffffffff00000000U) +
                        0x100000000 |
                       (ulong)((long)pTVar6 - (long)__lace_worker->dq) >> 6 & 0xffffffff);
          UNLOCK();
          pWVar2->allstolen = '\0';
          __lace_worker->split = __lace_dq_head + 1;
          __lace_worker->allstolen = '\0';
        }
        __lace_dq_head = __lace_dq_head + 1;
        iVar5 = iVar5 + 1;
        pTVar6 = pTVar6 + 1;
        lVar7 = lVar7 + 0x100000000;
        uVar4 = *(uint *)(next_in + (long)(int)v_00 * 4);
      } while (uVar4 != 0xffffffff);
    }
    compute_val(this,__lace_worker,__lace_dq_head,v_00);
    for (; iVar5 != 0; iVar5 = iVar5 + -1) {
      pTVar6 = __lace_dq_head + -1;
      if ((__lace_worker->_public->movesplit == '\0') && (__lace_worker->split <= pTVar6)) {
        __lace_dq_head[-1].thief._M_b._M_p = (__pointer_type)0x0;
        compute_val(*(PSISolver **)(__lace_dq_head[-1].d + 8),__lace_worker,pTVar6,
                    *(int *)__lace_dq_head[-1].d);
      }
      else {
        compute_val_SYNC_SLOW(__lace_worker,pTVar6);
      }
      __lace_dq_head = pTVar6;
    }
  }
  return;
}

Assistant:

void
PSISolver::compute_val(WorkerP* __lace_worker, Task* __lace_dq_head, int v)
{
    // mark node as visited
    done[v] = 1;

    // compute valuation of current node
    int st = str[v];
    int *dst = val + k*v;
    if (st == -1 or halt[st]) memset(dst, 0, sizeof(int[k]));
    else memcpy(dst, val + k*st, sizeof(int[k])); // copy from successor
    dst[priority(v)]++;

    // recursively update predecessor positions
    int count = 0;
    int from = first_in[v];
    while (from != -1) {
        int next = next_in[from];
        if (next != -1) {
            SPAWN(compute_val, from, this);
            count++;
        } else {
            CALL(compute_val, from, this);
            break;
        }
        from = next;
    }

    while (count--) {
        SYNC(compute_val);
    }
}